

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bag.h
# Opt level: O3

CompilationOptions * __thiscall slang::Bag::get<slang::ast::CompilationOptions>(Bag *this)

{
  group_type_pointer pgVar1;
  group_type_pointer pgVar2;
  value_type_pointer ppVar3;
  ulong uVar4;
  char *__s2;
  uint uVar5;
  undefined1 auVar6 [16];
  byte bVar7;
  uchar uVar8;
  uchar uVar9;
  uchar uVar10;
  byte bVar11;
  int iVar12;
  uint uVar13;
  size_t sVar14;
  CompilationOptions *pCVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  long lVar19;
  undefined1 auVar20 [16];
  
  sVar14 = std::type_info::hash_code((type_info *)&ast::CompilationOptions::typeinfo);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = sVar14;
  uVar16 = SUB168(auVar6 * ZEXT816(0x9e3779b97f4a7c15),8) ^
           SUB168(auVar6 * ZEXT816(0x9e3779b97f4a7c15),0);
  uVar18 = uVar16 >> ((byte)(this->items).table_.
                            super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::type_index,_std::any>,_slang::hash<std::type_index>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::any>_>_>
                            .arrays.groups_size_index & 0x3f);
  pgVar2 = (this->items).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::type_index,_std::any>,_slang::hash<std::type_index>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::any>_>_>
           .arrays.groups_;
  lVar19 = (uVar16 & 0xff) * 4;
  uVar8 = (&UNK_0092f4ac)[lVar19];
  uVar9 = (&UNK_0092f4ad)[lVar19];
  uVar10 = (&UNK_0092f4ae)[lVar19];
  bVar11 = (&UNK_0092f4af)[lVar19];
  ppVar3 = (this->items).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::type_index,_std::any>,_slang::hash<std::type_index>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::any>_>_>
           .arrays.elements_;
  uVar4 = (this->items).table_.
          super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::type_index,_std::any>,_slang::hash<std::type_index>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::any>_>_>
          .arrays.groups_size_mask;
  uVar17 = 0;
  do {
    pgVar1 = pgVar2 + uVar18;
    bVar7 = pgVar1->m[0xf].n;
    auVar20[0] = -(pgVar1->m[0].n == uVar8);
    auVar20[1] = -(pgVar1->m[1].n == uVar9);
    auVar20[2] = -(pgVar1->m[2].n == uVar10);
    auVar20[3] = -(pgVar1->m[3].n == bVar11);
    auVar20[4] = -(pgVar1->m[4].n == uVar8);
    auVar20[5] = -(pgVar1->m[5].n == uVar9);
    auVar20[6] = -(pgVar1->m[6].n == uVar10);
    auVar20[7] = -(pgVar1->m[7].n == bVar11);
    auVar20[8] = -(pgVar1->m[8].n == uVar8);
    auVar20[9] = -(pgVar1->m[9].n == uVar9);
    auVar20[10] = -(pgVar1->m[10].n == uVar10);
    auVar20[0xb] = -(pgVar1->m[0xb].n == bVar11);
    auVar20[0xc] = -(pgVar1->m[0xc].n == uVar8);
    auVar20[0xd] = -(pgVar1->m[0xd].n == uVar9);
    auVar20[0xe] = -(pgVar1->m[0xe].n == uVar10);
    auVar20[0xf] = -(bVar7 == bVar11);
    for (uVar13 = (uint)(ushort)((ushort)(SUB161(auVar20 >> 7,0) & 1) |
                                 (ushort)(SUB161(auVar20 >> 0xf,0) & 1) << 1 |
                                 (ushort)(SUB161(auVar20 >> 0x17,0) & 1) << 2 |
                                 (ushort)(SUB161(auVar20 >> 0x1f,0) & 1) << 3 |
                                 (ushort)(SUB161(auVar20 >> 0x27,0) & 1) << 4 |
                                 (ushort)(SUB161(auVar20 >> 0x2f,0) & 1) << 5 |
                                 (ushort)(SUB161(auVar20 >> 0x37,0) & 1) << 6 |
                                 (ushort)(SUB161(auVar20 >> 0x3f,0) & 1) << 7 |
                                 (ushort)(SUB161(auVar20 >> 0x47,0) & 1) << 8 |
                                 (ushort)(SUB161(auVar20 >> 0x4f,0) & 1) << 9 |
                                 (ushort)(SUB161(auVar20 >> 0x57,0) & 1) << 10 |
                                 (ushort)(SUB161(auVar20 >> 0x5f,0) & 1) << 0xb |
                                 (ushort)(SUB161(auVar20 >> 0x67,0) & 1) << 0xc |
                                 (ushort)(SUB161(auVar20 >> 0x6f,0) & 1) << 0xd |
                                (ushort)(SUB161(auVar20 >> 0x77,0) & 1) << 0xe); uVar13 != 0;
        uVar13 = uVar13 - 1 & uVar13) {
      uVar5 = 0;
      if (uVar13 != 0) {
        for (; (uVar13 >> uVar5 & 1) == 0; uVar5 = uVar5 + 1) {
        }
      }
      __s2 = *(char **)(ppVar3[uVar18 * 0xf + (ulong)uVar5].first._M_target + 8);
      if ((__s2 == "N5slang3ast18CompilationOptionsE") ||
         (iVar12 = strcmp("N5slang3ast18CompilationOptionsE",__s2), iVar12 == 0)) {
        pCVar15 = (CompilationOptions *)
                  std::__any_caster<slang::ast::CompilationOptions>
                            (&ppVar3[uVar18 * 0xf + (ulong)uVar5].second);
        return pCVar15;
      }
    }
    if (((&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
           is_not_overflowed(unsigned_long)::shift)[(uint)uVar16 & 7] & bVar7) == 0) {
      return (CompilationOptions *)0x0;
    }
    lVar19 = uVar18 + uVar17;
    uVar17 = uVar17 + 1;
    uVar18 = lVar19 + 1U & uVar4;
  } while (uVar17 <= uVar4);
  return (CompilationOptions *)0x0;
}

Assistant:

const T* get() const {
        auto it = items.find(SLANG_TYPEOF(T));
        if (it == items.end())
            return nullptr;
        return std::any_cast<T>(&it->second);
    }